

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

ValueHashTable<Sym_*,_Value_*> * __thiscall
ValueHashTable<Sym_*,_Value_*>::Copy(ValueHashTable<Sym_*,_Value_*> *this)

{
  ValueHashTable<Sym_*,_Value_*> *pVVar1;
  DictionaryStats *pDVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  
  pVVar1 = New(this->alloc,this->tableSize);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
    SListBase<HashBucket<Sym*,Value*>,Memory::ArenaAllocator,RealCount>::
    CopyTo<&HashBucket<Sym*,Value*>::Copy>
              ((SListBase<HashBucket<Sym*,Value*>,Memory::ArenaAllocator,RealCount> *)
               ((long)&(this->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4),
               &this->alloc->super_ArenaAllocator,
               (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
               ((long)&(pVVar1->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    pDVar2 = DictionaryStats::Clone(this->stats);
    pVVar1->stats = pDVar2;
  }
  return pVVar1;
}

Assistant:

ValueHashTable *Copy()
    {
        ValueHashTable *newTable = ValueHashTable::New(this->alloc, this->tableSize);

        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].template CopyTo<HashBucket::Copy>(this->alloc, newTable->table[i]);
        }
#if PROFILE_DICTIONARY
        if (stats)
            newTable->stats = stats->Clone();
#endif
        return newTable;
    }